

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

function<void_(const_int_&)> * __thiscall
QtPromisePrivate::PromiseHandler<int,std::function<void(int_const&)>,int_const&>::
create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
          (function<void_(const_int_&)> *__return_storage_ptr__,
          PromiseHandler<int,std::function<void(int_const&)>,int_const&> *this,
          function<void_(const_int_&)> *handler,QPromiseResolve<void> *resolve,
          QPromiseReject<void> *reject)

{
  anon_class_48_3_a63a5800 local_40;
  
  local_40.resolve.m_resolver.m_d.d =
       *(PromiseResolver<void> *)&(handler->super__Function_base)._M_functor;
  if (local_40.resolve.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)0x0) {
    LOCK();
    (((Data *)local_40.resolve.m_resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_40.resolve.m_resolver.m_d.d)->super_QSharedData).ref.
         super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
         _M_i + 1;
    UNLOCK();
  }
  local_40.reject.m_resolver.m_d.d = (PromiseResolver<void>)(resolve->m_resolver).m_d.d;
  if (local_40.reject.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)0x0) {
    LOCK();
    (((Data *)local_40.reject.m_resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((Data *)local_40.reject.m_resolver.m_d.d)->super_QSharedData).ref.
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  std::function<void_(const_int_&)>::function
            (&local_40.handler,(function<void_(const_int_&)> *)this);
  std::function<void(int_const&)>::
  function<QtPromisePrivate::PromiseHandler<int,std::function<void(int_const&)>,int_const&>::create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(std::function<void(int_const&)>const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)::_lambda(int_const&)_1_,void>
            ((function<void(int_const&)> *)__return_storage_ptr__,&local_40);
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(std::function<void(int_const&)>const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(int_const&)#1}::~create((_lambda_int_const___1_ *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static std::function<void(const T&)>
    create(const THandler& handler, const TResolve& resolve, const TReject& reject)
    {
        return [=](const T& value) {
            PromiseDispatch<ResType>::call(resolve, reject, handler, value);
        };
    }